

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_node.c
# Opt level: O3

int mpt_parse_node(mpt_node *root,mpt_parser_context *parse,char *fmt)

{
  int iVar1;
  mpt_input_parser_t next;
  mpt_parser_format pfmt;
  mpt_node conf;
  mpt_node *local_70;
  mpt_parser_format local_64;
  mpt_node local_58;
  
  local_70 = &local_58;
  local_58.children = (mpt_node *)0x0;
  local_58.prev = (mpt_node *)0x0;
  local_58.parent = (mpt_node *)0x0;
  local_58._meta = (mpt_metatype *)0x0;
  local_58.next = (mpt_node *)0x0;
  local_58.ident._base = (char *)0x0;
  local_58.ident._len = 0;
  local_58.ident._charset = '\0';
  local_58.ident._max = '\f';
  local_58.ident._val[0] = '\0';
  local_58.ident._val[1] = '\0';
  local_58.ident._val[2] = '\0';
  local_58.ident._val[3] = '\0';
  iVar1 = -1;
  if (parse != (mpt_parser_context *)0x0 && root != (mpt_node *)0x0) {
    iVar1 = mpt_parse_format(&local_64,fmt);
    next = mpt_parse_next_fcn(iVar1);
    if (next == (mpt_input_parser_t)0x0) {
      iVar1 = -3;
    }
    else {
      parse->prev = '\x01';
      iVar1 = mpt_parse_config(next,&local_64,parse,saveAppend,&local_70);
      if (iVar1 < 0) {
        mpt_node_clear(&local_58);
      }
      else if (root->children == (mpt_node *)0x0) {
        root->children = local_58.children;
      }
      else if (local_58.children != (mpt_node *)0x0) {
        mpt_node_move(&root->children,local_58.children);
        mpt_node_clear(root);
        root->children = local_58.children;
        for (; local_58.children != (mpt_node *)0x0; local_58.children = (local_58.children)->next)
        {
          (local_58.children)->parent = root;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_parse_node(MPT_STRUCT(node) *root, MPT_STRUCT(parser_context) *parse, const char *fmt)
{
	MPT_STRUCT(node) conf = MPT_NODE_INIT;
	MPT_STRUCT(node) *curr = &conf;
	MPT_STRUCT(parser_format) pfmt;
	MPT_TYPE(input_parser) next;
	int err;
	
	if (!root || !parse) {
		return MPT_ERROR(BadArgument);
	}
	err = mpt_parse_format(&pfmt, fmt);
	
	if (!(next = mpt_parse_next_fcn(err))) {
		return MPT_ERROR(BadType);
	}
	parse->prev = MPT_PARSEFLAG(Section);
	
	err = mpt_parse_config(next, &pfmt, parse, saveAppend, &curr);
	
	/* clear created nodes on error */
	if (err < 0) {
		mpt_node_clear(&conf);
		return err;
	}
	
	/* create new nodes */
	if (!(root->children)) {
		root->children = conf.children;
	}
	/* add to existing */
	else if (conf.children) {
		/* move/set non-present entries */
		mpt_node_move(&root->children, conf.children);
		/* clear remaining/superseeded entries */
		mpt_node_clear(root);
		/* replave tree with merged data */
		root->children = curr = conf.children;
		/* set parent for moved nodes */
		while (curr) {
			curr->parent = root;
			curr = curr->next;
		}
	}
	return err;
}